

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itch50_handler.cc
# Opt level: O1

void __thiscall helix::nasdaq::itch50_handler::process_msg(itch50_handler *this,itch50_trade *m)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  undefined8 uVar4;
  __hash_code __code;
  ulong uVar5;
  ulong uVar6;
  __node_base_ptr p_Var7;
  __node_base_ptr p_Var8;
  trade t;
  event local_70;
  trade local_30;
  
  p_Var3 = (_Hash_node_base *)(ulong)m->StockLocate;
  uVar6 = (this->order_book_id_map)._M_h._M_bucket_count;
  uVar5 = (ulong)p_Var3 % uVar6;
  p_Var7 = (this->order_book_id_map)._M_h._M_buckets[uVar5 & 0xffffffff];
  p_Var8 = (__node_base_ptr)0x0;
  if ((p_Var7 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var7->_M_nxt, p_Var8 = p_Var7, p_Var7->_M_nxt[1]._M_nxt != p_Var3)) {
    while (p_Var7 = p_Var2, p_Var2 = p_Var7->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var8 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar6 != uVar5) ||
         (p_Var8 = p_Var7, p_Var2[1]._M_nxt == p_Var3)) goto LAB_00114460;
    }
    p_Var8 = (__node_base_ptr)0x0;
  }
LAB_00114460:
  if (p_Var8 == (__node_base_ptr)0x0) {
    p_Var3 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var3 = p_Var8->_M_nxt;
  }
  if (p_Var3 != (_Hash_node_base *)0x0) {
    uVar1 = m->Price;
    local_30.price =
         (uint64_t)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    uVar1 = m->Shares;
    local_30.size =
         (uint64_t)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18)
    ;
    uVar6 = (ulong)*(ushort *)&m->field_0x9 << 0x20;
    uVar5 = (ulong)*(uint6 *)&m->field_0x5;
    local_30.timestamp =
         ((uVar6 & 0xff0000000000) >> 0x18 | (uVar6 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8
          | (uVar5 & 0xff0000) << 0x18 | (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38) >> 0x10;
    local_30.sign = non_displayable;
    make_trade_event(&local_70,(string *)(p_Var3 + 2),local_30.timestamp,&local_30,0);
    if ((this->_process_event).super__Function_base._M_manager == (_Manager_type)0x0) {
      uVar4 = std::__throw_bad_function_call();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
        operator_delete(local_70._symbol._M_dataplus._M_p,
                        local_70._symbol.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(uVar4);
    }
    (*(this->_process_event)._M_invoker)((_Any_data *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._symbol._M_dataplus._M_p != &local_70._symbol.field_2) {
      operator_delete(local_70._symbol._M_dataplus._M_p,
                      local_70._symbol.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void itch50_handler::process_msg(const itch50_trade* m)
{
    auto it = order_book_id_map.find(m->StockLocate);
    if (it != order_book_id_map.end()) {
        uint64_t trade_price = be32toh(m->Price);
        uint32_t quantity = be32toh(m->Shares);
        auto& ob = it->second;
        auto timestamp = itch50_timestamp(m->Timestamp);
        trade t{timestamp, trade_price, quantity, trade_sign::non_displayable};
        _process_event(make_trade_event(ob.symbol(), timestamp, &t));
    }
}